

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void VW::setup_example(vw *all,example *ae)

{
  unsigned_long *puVar1;
  bool bVar2;
  uint uVar3;
  parser *ppVar4;
  byte *pbVar5;
  uint32_t *puVar6;
  byte bVar7;
  long lVar8;
  example *__range2;
  uint uVar9;
  size_t sVar10;
  unsigned_long *puVar11;
  byte *pbVar12;
  float fVar13;
  float new_features_sum_feat_sq;
  size_t new_features_cnt;
  example *local_38;
  float local_2c;
  size_t local_28;
  
  ppVar4 = all->p;
  local_38 = ae;
  if ((ppVar4->sort_features == true) && (ae->sorted == false)) {
    unique_sort_features(all->parse_mask,ae);
    ppVar4 = all->p;
  }
  if (ppVar4->write_cache == true) {
    (*(ppVar4->lp).cache_label)(&ae->l,ppVar4->output);
    cache_features(all->p->output,ae,all->parse_mask);
  }
  ae->partial_prediction = 0.0;
  uVar3 = 0;
  ae->num_features = 0;
  ae->loss = 0.0;
  ae->total_sum_feat_sq = 0.0;
  ae->example_counter = all->p->end_parsed_examples;
  ppVar4 = all->p;
  bVar7 = 1;
  if (ppVar4->emptylines_separate_examples == false) {
    ppVar4->in_pass_counter = ppVar4->in_pass_counter + 1;
    ppVar4 = all->p;
    bVar7 = ppVar4->emptylines_separate_examples;
  }
  uVar9 = all->holdout_period - 1;
  if ((bVar7 & 1) == 0) {
    uVar9 = uVar3;
  }
  if (all->holdout_set_off == false) {
    if (all->holdout_after == 0) {
      uVar3 = (uint)(ppVar4->in_pass_counter % all->holdout_period == uVar9);
    }
    else {
      uVar3 = (uint)(all->holdout_after <= ppVar4->in_pass_counter);
    }
  }
  ae->test_only = SUB41(uVar3,0);
  bVar2 = (*(all->p->lp).test_label)(&ae->l);
  ae->test_only = (bool)(ae->test_only | bVar2);
  ppVar4 = all->p;
  if (((ppVar4->emptylines_separate_examples == true) && ((ae->tag)._end == (ae->tag)._begin)) &&
     ((ae->super_example_predict).indices._end == (ae->super_example_predict).indices._begin)) {
    ppVar4->in_pass_counter = ppVar4->in_pass_counter + 1;
    ppVar4 = all->p;
  }
  fVar13 = (*(ppVar4->lp).get_weight)(&ae->l);
  ae->weight = fVar13;
  if (all->ignore_some == true) {
    pbVar12 = (ae->super_example_predict).indices._begin;
    pbVar5 = (ae->super_example_predict).indices._end;
    if (pbVar12 != pbVar5) {
      do {
        if (all->ignore[*pbVar12] == true) {
          features::clear((ae->super_example_predict).feature_space + *pbVar12);
          memmove(pbVar12,pbVar12 + 1,
                  (long)(ae->super_example_predict).indices._end - (long)(pbVar12 + 1));
          pbVar5 = (ae->super_example_predict).indices._end + -1;
          (ae->super_example_predict).indices._end = pbVar5;
          pbVar12 = pbVar12 + -1;
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != pbVar5);
    }
  }
  if ((all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    generateGrams(all,&local_38);
  }
  if (all->add_constant == true) {
    add_constant_feature(all,ae);
  }
  if ((all->limit_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->limit_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    feature_limit(all,ae);
  }
  puVar6 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar6 = &(all->weights).sparse_weights._stride_shift;
  }
  lVar8 = (ulong)all->wpp << ((byte)*puVar6 & 0x3f);
  pbVar12 = (ae->super_example_predict).indices._begin;
  if ((lVar8 != 1) && (pbVar5 = (ae->super_example_predict).indices._end, pbVar12 != pbVar5)) {
    do {
      puVar1 = (ae->super_example_predict).feature_space[*pbVar12].indicies._end;
      for (puVar11 = (ae->super_example_predict).feature_space[*pbVar12].indicies._begin;
          puVar11 != puVar1; puVar11 = puVar11 + 1) {
        *puVar11 = *puVar11 * lVar8;
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar5);
    pbVar12 = (ae->super_example_predict).indices._begin;
  }
  ae->num_features = 0;
  ae->total_sum_feat_sq = 0.0;
  pbVar5 = (ae->super_example_predict).indices._end;
  if (pbVar12 != pbVar5) {
    fVar13 = 0.0;
    sVar10 = 0;
    do {
      bVar7 = *pbVar12;
      sVar10 = sVar10 + ((long)(ae->super_example_predict).feature_space[bVar7].values._end -
                         (long)(ae->super_example_predict).feature_space[bVar7].values._begin >> 2);
      ae->num_features = sVar10;
      fVar13 = fVar13 + (ae->super_example_predict).feature_space[bVar7].sum_feat_sq;
      ae->total_sum_feat_sq = fVar13;
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar5);
  }
  INTERACTIONS::eval_count_of_generated_ft(all,ae,&local_28,&local_2c);
  ae->num_features = ae->num_features + local_28;
  ae->total_sum_feat_sq = local_2c + ae->total_sum_feat_sq;
  return;
}

Assistant:

void setup_example(vw& all, example* ae)
{
  if (all.p->sort_features && ae->sorted == false)
    unique_sort_features(all.parse_mask, ae);

  if (all.p->write_cache)
  {
    all.p->lp.cache_label(&ae->l, *(all.p->output));
    cache_features(*(all.p->output), ae, all.parse_mask);
  }

  ae->partial_prediction = 0.;
  ae->num_features = 0;
  ae->total_sum_feat_sq = 0;
  ae->loss = 0.;

  ae->example_counter = (size_t)(all.p->end_parsed_examples);
  if (!all.p->emptylines_separate_examples)
    all.p->in_pass_counter++;

  ae->test_only = is_test_only(all.p->in_pass_counter, all.holdout_period, all.holdout_after, all.holdout_set_off,
      all.p->emptylines_separate_examples ? (all.holdout_period - 1) : 0);
  ae->test_only |= all.p->lp.test_label(&ae->l);

  if (all.p->emptylines_separate_examples && example_is_newline(*ae))
    all.p->in_pass_counter++;

  ae->weight = all.p->lp.get_weight(&ae->l);

  if (all.ignore_some)
    for (unsigned char* i = ae->indices.begin(); i != ae->indices.end(); i++)
      if (all.ignore[*i])
      {
        // delete namespace
        ae->feature_space[*i].clear();
        memmove(i, i + 1, (ae->indices.end() - (i + 1)) * sizeof(*i));
        ae->indices.end()--;
        i--;
      }

  if (all.ngram_strings.size() > 0)
    generateGrams(all, ae);

  if (all.add_constant)  // add constant feature
    VW::add_constant_feature(all, ae);

  if (all.limit_strings.size() > 0)
    feature_limit(all, ae);

  uint64_t multiplier = (uint64_t)all.wpp << all.weights.stride_shift();

  if (multiplier != 1)  // make room for per-feature information.
    for (features& fs : *ae)
      for (auto& j : fs.indicies) j *= multiplier;
  ae->num_features = 0;
  ae->total_sum_feat_sq = 0;
  for (features& fs : *ae)
  {
    ae->num_features += fs.size();
    ae->total_sum_feat_sq += fs.sum_feat_sq;
  }

  size_t new_features_cnt;
  float new_features_sum_feat_sq;
  INTERACTIONS::eval_count_of_generated_ft(all, *ae, new_features_cnt, new_features_sum_feat_sq);
  ae->num_features += new_features_cnt;
  ae->total_sum_feat_sq += new_features_sum_feat_sq;
}